

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

bool __thiscall jrtplib::RTCPSDESPacket::GotoNextChunk(RTCPSDESPacket *this)

{
  int iVar1;
  int iVar2;
  uint8_t *local_28;
  RTCPSDESHeader *sdeshdr;
  size_t offset;
  RTCPSDESPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else if (this->currentchunk == (uint8_t *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = this->curchunknum;
    iVar2 = GetChunkCount(this);
    if (iVar1 == iVar2) {
      this_local._7_1_ = false;
    }
    else {
      sdeshdr = (RTCPSDESHeader *)0x4;
      local_28 = this->currentchunk + 4;
      while (*local_28 != '\0') {
        sdeshdr = (RTCPSDESHeader *)(&sdeshdr[1].sdesid + local_28[1]);
        local_28 = this->currentchunk + (long)sdeshdr;
      }
      sdeshdr = (RTCPSDESHeader *)&sdeshdr->length;
      if (((ulong)sdeshdr & 3) != 0) {
        sdeshdr = (RTCPSDESHeader *)((long)sdeshdr + (4 - ((ulong)sdeshdr & 3)));
      }
      this->currentchunk = this->currentchunk + (long)&sdeshdr->sdesid;
      this->curchunknum = this->curchunknum + 1;
      this->itemoffset = 4;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool RTCPSDESPacket::GotoNextChunk()
{
	if (!knownformat)
		return false;
	if (currentchunk == 0)
		return false;
	if (curchunknum == GetChunkCount())
		return false;
	
	size_t offset = sizeof(uint32_t);
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+sizeof(uint32_t));
	
	while (sdeshdr->sdesid != 0)
	{
		offset += sizeof(RTCPSDESHeader);
		offset += (size_t)(sdeshdr->length);
		sdeshdr = (RTCPSDESHeader *)(currentchunk+offset);
	}
	offset++; // for the zero byte
	if ((offset&0x03) != 0)
		offset += (4-(offset&0x03));
	currentchunk += offset;
	curchunknum++;
	itemoffset = sizeof(uint32_t);
	return true;
}